

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O2

void trimLine(void)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = strlen(inputBuffer);
  uVar2 = sVar1 & 0xffffffff;
  while (((1 < (int)uVar2 && ((ulong)(byte)(&DAT_001101cf)[uVar2] < 0x21)) &&
         ((0x100000600U >> ((ulong)(byte)(&DAT_001101cf)[uVar2] & 0x3f) & 1) != 0))) {
    (&DAT_001101cf)[uVar2] = 0;
    uVar2 = uVar2 - 1;
  }
  return;
}

Assistant:

void trimLine()
{
    int index = (int)strlen(inputBuffer) - 1;

    while(index > 0) {
        if((inputBuffer[index] == ' ') || (inputBuffer[index] == '\t') || (inputBuffer[index] == '\n')) {
            inputBuffer[index--] = 0;
        } else {
            break;
        }
    }
}